

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

uint GetErrorLocationLineNumber(char *codeStart,char *errorPos)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((errorPos != (char *)0x0 && codeStart != (char *)0x0) && (uVar1 = 1, codeStart < errorPos)) {
    do {
      uVar1 = uVar1 + (*codeStart == '\n');
      codeStart = codeStart + 1;
    } while (codeStart != errorPos);
  }
  return uVar1;
}

Assistant:

unsigned GetErrorLocationLineNumber(const char *codeStart, const char *errorPos)
{
	if(!codeStart)
		return 0;

	if(!errorPos)
		return 0;

	int line = 1;
	for(const char *pos = codeStart; pos < errorPos; pos++)
		line += *pos == '\n';

	return line;
}